

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O2

parser_error parse_player_timed_effect_flags(parser *p)

{
  _Bool _Var1;
  int iVar2;
  long *plVar3;
  char *pcVar4;
  char *str;
  parser_error pVar5;
  
  plVar3 = (long *)parser_priv(p);
  if (plVar3 == (long *)0x0) {
    __assert_fail("ps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/player-timed.c"
                  ,0x239,"enum parser_error parse_player_timed_effect_flags(struct parser *)");
  }
  if (*plVar3 == 0) {
    pVar5 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    _Var1 = parser_hasval(p,"flags");
    pVar5 = PARSE_ERROR_NONE;
    if (_Var1) {
      pcVar4 = parser_getstr(p,"flags");
      str = string_make(pcVar4);
      pVar5 = PARSE_ERROR_NONE;
      pcVar4 = str;
      while( true ) {
        pcVar4 = strtok(pcVar4," |");
        if (pcVar4 == (char *)0x0) break;
        iVar2 = strcmp(pcVar4,"NONSTACKING");
        if (iVar2 != 0) {
          pVar5 = PARSE_ERROR_INVALID_FLAG;
          break;
        }
        *(byte *)(*plVar3 + 0x58) = *(byte *)(*plVar3 + 0x58) | 1;
        pcVar4 = (char *)0x0;
      }
      string_free(str);
    }
  }
  return pVar5;
}

Assistant:

static enum parser_error parse_player_timed_effect_flags(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);
	char *flags, *s;

	assert(ps);
	if (!ps->t) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (!parser_hasval(p, "flags")) {
		return PARSE_ERROR_NONE;
	}
	flags = string_make(parser_getstr(p, "flags"));
	s = strtok(flags, " |");
	while (s) {
		if (streq(s, "NONSTACKING")) {
			ps->t->flags |= TMD_FLAG_NONSTACKING;
		} else {
			string_free(flags);
			return PARSE_ERROR_INVALID_FLAG;
		}
		s = strtok(NULL, " |");
	}
	string_free(flags);
	return PARSE_ERROR_NONE;
}